

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O2

string * __thiscall
cmCTestGIT::GetWorkingRevision_abi_cxx11_(string *__return_storage_ptr__,cmCTestGIT *this)

{
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_17d;
  allocator<char> local_17c;
  allocator<char> local_17b;
  allocator<char> local_17a;
  allocator<char> local_179;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  git_rev_list;
  string local_160;
  string git;
  OutputLogger err;
  OneLineParser out;
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  std::__cxx11::string::string
            ((string *)&git,(string *)&(this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool
            );
  std::__cxx11::string::string((string *)&out,(string *)&git);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&out.super_LineParser.Line._M_string_length,"rev-list",
             (allocator<char> *)&err);
  std::__cxx11::string::string<std::allocator<char>>((string *)&out.Line1,"-n",&local_179);
  std::__cxx11::string::string<std::allocator<char>>(local_80,"1",&local_17a);
  std::__cxx11::string::string<std::allocator<char>>(local_60,"HEAD",&local_17b);
  std::__cxx11::string::string<std::allocator<char>>(local_40,"--",&local_17c);
  __l._M_len = 6;
  __l._M_array = (iterator)&out;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&git_rev_list,__l,&local_17d);
  lVar1 = 0xa0;
  do {
    std::__cxx11::string::~string
              ((string *)((long)&out.super_LineParser.super_OutputParser._vptr_OutputParser + lVar1)
              );
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  OneLineParser::OneLineParser(&out,this,"rl-out> ",__return_storage_ptr__);
  cmProcessTools::OutputLogger::OutputLogger
            (&err,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"rl-err> ");
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  local_160._M_string_length = 0;
  local_160.field_2._M_local_buf[0] = '\0';
  cmCTestVC::RunChild((cmCTestVC *)this,&git_rev_list,(OutputParser *)&out,(OutputParser *)&err,
                      &local_160,Auto);
  std::__cxx11::string::~string((string *)&local_160);
  cmProcessTools::LineParser::~LineParser(&err.super_LineParser);
  cmProcessTools::LineParser::~LineParser(&out.super_LineParser);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&git_rev_list);
  std::__cxx11::string::~string((string *)&git);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestGIT::GetWorkingRevision()
{
  // Run plumbing "git rev-list" to get work tree revision.
  std::string git = this->CommandLineTool;
  std::vector<std::string> git_rev_list = { git, "rev-list", "-n",
                                            "1", "HEAD",     "--" };
  std::string rev;
  OneLineParser out(this, "rl-out> ", rev);
  OutputLogger err(this->Log, "rl-err> ");
  this->RunChild(git_rev_list, &out, &err);
  return rev;
}